

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int freePage2(BtShared *pBt,MemPage *pMemPage,Pgno iPage)

{
  i16 *piVar1;
  MemPage *pMVar2;
  u8 *puVar3;
  DbPage *pDVar4;
  MemPage *pMVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  MemPage *pTrunk;
  int local_44;
  MemPage *local_40;
  MemPage *local_38;
  
  local_40 = (MemPage *)0x0;
  pMVar2 = pBt->pPage1;
  if (pMemPage == (MemPage *)0x0) {
    pMemPage = btreePageLookup(pBt,iPage);
  }
  else {
    piVar1 = &pMemPage->pDbPage->nRef;
    *piVar1 = *piVar1 + 1;
  }
  local_38 = pMemPage;
  iVar6 = sqlite3PagerWrite(pMVar2->pDbPage);
  local_44 = iVar6;
  if (iVar6 == 0) {
    uVar9 = *(uint *)(pMVar2->aData + 0x24);
    uVar8 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    uVar9 = uVar8 + 1;
    *(uint *)(pMVar2->aData + 0x24) =
         uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 * 0x1000000;
    if ((pBt->btsFlags & 4) == 0) {
LAB_0013862e:
      if ((pBt->autoVacuum == '\0') ||
         (ptrmapPut(pBt,iPage,'\x02',0,&local_44), iVar6 = local_44, local_44 == 0)) {
        if (uVar8 == 0) {
          uVar9 = 0;
LAB_001386f9:
          if ((pMemPage != (MemPage *)0x0) ||
             (iVar6 = btreeGetPage(pBt,iPage,&local_38,0), pMemPage = local_38, iVar6 == 0)) {
            iVar6 = sqlite3PagerWrite(pMemPage->pDbPage);
            if (iVar6 == 0) {
              *(uint *)pMemPage->aData =
                   uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
              puVar3 = pMemPage->aData;
              puVar3[4] = '\0';
              puVar3[5] = '\0';
              puVar3[6] = '\0';
              puVar3[7] = '\0';
              *(Pgno *)(pMVar2->aData + 0x20) =
                   iPage >> 0x18 | (iPage & 0xff0000) >> 8 | (iPage & 0xff00) << 8 | iPage << 0x18;
              iVar6 = 0;
            }
            goto LAB_001385b1;
          }
        }
        else {
          uVar9 = *(uint *)(pMVar2->aData + 0x20);
          uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
          iVar6 = btreeGetPage(pBt,uVar9,&local_40,0);
          pMVar5 = local_40;
          if (iVar6 == 0) {
            uVar8 = *(uint *)(local_40->aData + 4);
            uVar7 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
            uVar8 = pBt->usableSize >> 2;
            if (uVar8 - 2 < uVar7) {
              iVar6 = 0xb;
              sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xe503,
                          "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
            }
            else {
              if (uVar8 - 8 <= uVar7) goto LAB_001386f9;
              iVar6 = sqlite3PagerWrite(local_40->pDbPage);
              if (iVar6 == 0) {
                uVar9 = uVar7 + 1;
                *(uint *)(pMVar5->aData + 4) =
                     uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                     uVar9 * 0x1000000;
                *(Pgno *)(pMVar5->aData + (uVar7 * 4 + 8)) =
                     iPage >> 0x18 | (iPage & 0xff0000) >> 8 | (iPage & 0xff00) << 8 | iPage << 0x18
                ;
                if ((pMemPage != (MemPage *)0x0) && ((pBt->btsFlags & 4) == 0)) {
                  pDVar4 = pMemPage->pDbPage;
                  if (((pDVar4->flags & 2) != 0) && (pDVar4->pPager->nSavepoint == 0)) {
                    pDVar4->flags = pDVar4->flags | 0x20;
                  }
                }
                iVar6 = btreeSetHasContent(pBt,iPage);
              }
            }
          }
        }
      }
      goto LAB_001385ac;
    }
    if ((pMemPage == (MemPage *)0x0) &&
       (iVar6 = btreeGetPage(pBt,iPage,&local_38,0), pMemPage = local_38, iVar6 != 0))
    goto LAB_001385ac;
    iVar6 = sqlite3PagerWrite(pMemPage->pDbPage);
    local_44 = iVar6;
    if (iVar6 == 0) {
      memset(pMemPage->aData,0,(ulong)pMemPage->pBt->pageSize);
      goto LAB_0013862e;
    }
  }
  else {
LAB_001385ac:
    if (pMemPage == (MemPage *)0x0) goto LAB_001385bd;
  }
LAB_001385b1:
  pMemPage->isInit = '\0';
  sqlite3PagerUnrefNotNull(pMemPage->pDbPage);
LAB_001385bd:
  if (local_40 != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull(local_40->pDbPage);
  }
  return iVar6;
}

Assistant:

static int freePage2(BtShared *pBt, MemPage *pMemPage, Pgno iPage){
  MemPage *pTrunk = 0;                /* Free-list trunk page */
  Pgno iTrunk = 0;                    /* Page number of free-list trunk page */ 
  MemPage *pPage1 = pBt->pPage1;      /* Local reference to page 1 */
  MemPage *pPage;                     /* Page being freed. May be NULL. */
  int rc;                             /* Return Code */
  int nFree;                          /* Initial number of pages on free-list */

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( iPage>1 );
  assert( !pMemPage || pMemPage->pgno==iPage );

  if( pMemPage ){
    pPage = pMemPage;
    sqlite3PagerRef(pPage->pDbPage);
  }else{
    pPage = btreePageLookup(pBt, iPage);
  }

  /* Increment the free page count on pPage1 */
  rc = sqlite3PagerWrite(pPage1->pDbPage);
  if( rc ) goto freepage_out;
  nFree = get4byte(&pPage1->aData[36]);
  put4byte(&pPage1->aData[36], nFree+1);

  if( pBt->btsFlags & BTS_SECURE_DELETE ){
    /* If the secure_delete option is enabled, then
    ** always fully overwrite deleted information with zeros.
    */
    if( (!pPage && ((rc = btreeGetPage(pBt, iPage, &pPage, 0))!=0) )
     ||            ((rc = sqlite3PagerWrite(pPage->pDbPage))!=0)
    ){
      goto freepage_out;
    }
    memset(pPage->aData, 0, pPage->pBt->pageSize);
  }

  /* If the database supports auto-vacuum, write an entry in the pointer-map
  ** to indicate that the page is free.
  */
  if( ISAUTOVACUUM ){
    ptrmapPut(pBt, iPage, PTRMAP_FREEPAGE, 0, &rc);
    if( rc ) goto freepage_out;
  }

  /* Now manipulate the actual database free-list structure. There are two
  ** possibilities. If the free-list is currently empty, or if the first
  ** trunk page in the free-list is full, then this page will become a
  ** new free-list trunk page. Otherwise, it will become a leaf of the
  ** first trunk page in the current free-list. This block tests if it
  ** is possible to add the page as a new free-list leaf.
  */
  if( nFree!=0 ){
    u32 nLeaf;                /* Initial number of leaf cells on trunk page */

    iTrunk = get4byte(&pPage1->aData[32]);
    rc = btreeGetPage(pBt, iTrunk, &pTrunk, 0);
    if( rc!=SQLITE_OK ){
      goto freepage_out;
    }

    nLeaf = get4byte(&pTrunk->aData[4]);
    assert( pBt->usableSize>32 );
    if( nLeaf > (u32)pBt->usableSize/4 - 2 ){
      rc = SQLITE_CORRUPT_BKPT;
      goto freepage_out;
    }
    if( nLeaf < (u32)pBt->usableSize/4 - 8 ){
      /* In this case there is room on the trunk page to insert the page
      ** being freed as a new leaf.
      **
      ** Note that the trunk page is not really full until it contains
      ** usableSize/4 - 2 entries, not usableSize/4 - 8 entries as we have
      ** coded.  But due to a coding error in versions of SQLite prior to
      ** 3.6.0, databases with freelist trunk pages holding more than
      ** usableSize/4 - 8 entries will be reported as corrupt.  In order
      ** to maintain backwards compatibility with older versions of SQLite,
      ** we will continue to restrict the number of entries to usableSize/4 - 8
      ** for now.  At some point in the future (once everyone has upgraded
      ** to 3.6.0 or later) we should consider fixing the conditional above
      ** to read "usableSize/4-2" instead of "usableSize/4-8".
      **
      ** EVIDENCE-OF: R-19920-11576 However, newer versions of SQLite still
      ** avoid using the last six entries in the freelist trunk page array in
      ** order that database files created by newer versions of SQLite can be
      ** read by older versions of SQLite.
      */
      rc = sqlite3PagerWrite(pTrunk->pDbPage);
      if( rc==SQLITE_OK ){
        put4byte(&pTrunk->aData[4], nLeaf+1);
        put4byte(&pTrunk->aData[8+nLeaf*4], iPage);
        if( pPage && (pBt->btsFlags & BTS_SECURE_DELETE)==0 ){
          sqlite3PagerDontWrite(pPage->pDbPage);
        }
        rc = btreeSetHasContent(pBt, iPage);
      }
      TRACE(("FREE-PAGE: %d leaf on trunk page %d\n",pPage->pgno,pTrunk->pgno));
      goto freepage_out;
    }
  }

  /* If control flows to this point, then it was not possible to add the
  ** the page being freed as a leaf page of the first trunk in the free-list.
  ** Possibly because the free-list is empty, or possibly because the 
  ** first trunk in the free-list is full. Either way, the page being freed
  ** will become the new first trunk page in the free-list.
  */
  if( pPage==0 && SQLITE_OK!=(rc = btreeGetPage(pBt, iPage, &pPage, 0)) ){
    goto freepage_out;
  }
  rc = sqlite3PagerWrite(pPage->pDbPage);
  if( rc!=SQLITE_OK ){
    goto freepage_out;
  }
  put4byte(pPage->aData, iTrunk);
  put4byte(&pPage->aData[4], 0);
  put4byte(&pPage1->aData[32], iPage);
  TRACE(("FREE-PAGE: %d new trunk page replacing %d\n", pPage->pgno, iTrunk));

freepage_out:
  if( pPage ){
    pPage->isInit = 0;
  }
  releasePage(pPage);
  releasePage(pTrunk);
  return rc;
}